

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test>
             *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x448);
  anon_unknown.dwarf_be2d6c::
  HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test::
  HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test
            ((HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }